

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_wav__metadata_process_info_text_chunk
                    (ma_dr_wav__metadata_parser *pParser,ma_uint64 chunkSize,
                    ma_dr_wav_metadata_type type)

{
  ma_dr_wav_metadata *pmVar1;
  ma_uint64 mVar2;
  ma_uint8 *pmVar3;
  size_t sVar4;
  ulong uVar5;
  ma_uint64 *pmVar6;
  
  if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
    pParser->metadataCount = pParser->metadataCount + 1;
    uVar5 = chunkSize & 0xffffffff;
    pmVar6 = &pParser->extraCapacity;
    sVar4 = 0;
  }
  else {
    pmVar1 = pParser->pMetadata;
    mVar2 = pParser->metadataCursor;
    pmVar6 = &pParser->metadataCursor;
    pmVar1[mVar2].type = type;
    if (chunkSize == 0) {
      pmVar1[mVar2].data.cue.cuePointCount = 0;
      pmVar1[mVar2].data.cue.pCuePoints = (ma_dr_wav_cue_point *)0x0;
      uVar5 = 1;
      sVar4 = 0;
    }
    else {
      pmVar1[mVar2].data.cue.cuePointCount = (int)chunkSize - 1;
      pmVar3 = pParser->pDataCursor;
      pParser->pDataCursor = pmVar3 + (chunkSize & 0xffffffff);
      pmVar1[mVar2].data.bext.pOriginatorName = (char *)pmVar3;
      sVar4 = (*pParser->onRead)(pParser->pReadSeekUserData,pmVar3,chunkSize & 0xffffffff);
      uVar5 = 1;
      if (sVar4 != chunkSize) {
        return sVar4;
      }
    }
  }
  *pmVar6 = *pmVar6 + uVar5;
  return sVar4;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__metadata_process_info_text_chunk(ma_dr_wav__metadata_parser* pParser, ma_uint64 chunkSize, ma_dr_wav_metadata_type type)
{
    ma_uint64 bytesRead = 0;
    ma_uint32 stringSizeWithNullTerminator = (ma_uint32)chunkSize;
    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
        pParser->metadataCount += 1;
        ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, stringSizeWithNullTerminator, 1);
    } else {
        ma_dr_wav_metadata* pMetadata = &pParser->pMetadata[pParser->metadataCursor];
        pMetadata->type = type;
        if (stringSizeWithNullTerminator > 0) {
            pMetadata->data.infoText.stringLength = stringSizeWithNullTerminator - 1;
            pMetadata->data.infoText.pString = (char*)ma_dr_wav__metadata_get_memory(pParser, stringSizeWithNullTerminator, 1);
            MA_DR_WAV_ASSERT(pMetadata->data.infoText.pString != NULL);
            bytesRead = ma_dr_wav__metadata_parser_read(pParser, pMetadata->data.infoText.pString, (size_t)stringSizeWithNullTerminator, NULL);
            if (bytesRead == chunkSize) {
                pParser->metadataCursor += 1;
            } else {
            }
        } else {
            pMetadata->data.infoText.stringLength = 0;
            pMetadata->data.infoText.pString      = NULL;
            pParser->metadataCursor += 1;
        }
    }
    return bytesRead;
}